

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlCtxtNsCheckScope(xmlDebugCtxtPtr ctxt,xmlNodePtr node,xmlNsPtr ns)

{
  int iVar1;
  int ret;
  xmlNsPtr ns_local;
  xmlNodePtr node_local;
  xmlDebugCtxtPtr ctxt_local;
  
  iVar1 = xmlNsCheckScope(node,ns);
  if (iVar1 == -2) {
    if (ns->prefix == (xmlChar *)0x0) {
      xmlDebugErr(ctxt,0x13a6,"Reference to default namespace not in scope\n");
    }
    else {
      xmlDebugErr3(ctxt,0x13a6,"Reference to namespace \'%s\' not in scope\n",(char *)ns->prefix);
    }
  }
  if (iVar1 == -3) {
    if (ns->prefix == (xmlChar *)0x0) {
      xmlDebugErr(ctxt,0x13a7,"Reference to default namespace not on ancestor\n");
    }
    else {
      xmlDebugErr3(ctxt,0x13a7,"Reference to namespace \'%s\' not on ancestor\n",(char *)ns->prefix)
      ;
    }
  }
  return;
}

Assistant:

static void
xmlCtxtNsCheckScope(xmlDebugCtxtPtr ctxt, xmlNodePtr node, xmlNsPtr ns)
{
    int ret;

    ret = xmlNsCheckScope(node, ns);
    if (ret == -2) {
        if (ns->prefix == NULL)
	    xmlDebugErr(ctxt, XML_CHECK_NS_SCOPE,
			"Reference to default namespace not in scope\n");
	else
	    xmlDebugErr3(ctxt, XML_CHECK_NS_SCOPE,
			 "Reference to namespace '%s' not in scope\n",
			 (char *) ns->prefix);
    }
    if (ret == -3) {
        if (ns->prefix == NULL)
	    xmlDebugErr(ctxt, XML_CHECK_NS_ANCESTOR,
			"Reference to default namespace not on ancestor\n");
	else
	    xmlDebugErr3(ctxt, XML_CHECK_NS_ANCESTOR,
			 "Reference to namespace '%s' not on ancestor\n",
			 (char *) ns->prefix);
    }
}